

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

void CheckMempoolTRUCInvariants(CTxMemPool *tx_pool)

{
  long lVar1;
  bool bVar2;
  element_type *peVar3;
  long in_FS_OFFSET;
  reference_wrapper<const_CTxMemPoolEntry> *parent;
  Parents *__range4;
  Parents *parents;
  CTxMemPoolEntry *entry;
  TxMempoolInfo *tx_info;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *__range1;
  iterator __end4;
  iterator __begin4;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  CTxMemPoolEntry *in_stack_fffffffffffffea8;
  CTxMemPoolEntry *in_stack_fffffffffffffeb0;
  Parents *in_stack_fffffffffffffeb8;
  Txid *in_stack_fffffffffffffec0;
  CTxMemPool *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int32_t in_stack_fffffffffffffed4;
  CTxMemPool *in_stack_fffffffffffffed8;
  int line;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffee0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffee8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffea8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
  CTxMemPool::infoAll(in_stack_fffffffffffffed8);
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::begin
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)in_stack_fffffffffffffeb0);
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::end
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)in_stack_fffffffffffffeb0);
  while (bVar2 = __gnu_cxx::
                 operator==<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                           ((__normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                             *)in_stack_fffffffffffffeb8,
                            (__normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                             *)in_stack_fffffffffffffeb0), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
    ::operator*((__normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                 *)in_stack_fffffffffffffea8);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffea8);
    CTransaction::GetHash((CTransaction *)in_stack_fffffffffffffea8);
    CTxMemPool::GetEntry(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    inline_assertion_check<true,CTxMemPoolEntry_const*>
              ((CTxMemPoolEntry **)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)in_stack_fffffffffffffec8);
    peVar3 = std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffea8);
    line = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    if (peVar3->version == 3) {
      CTxMemPoolEntry::GetTxSize(in_stack_fffffffffffffea8);
      inline_assertion_check<true,bool>
                ((bool *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,line,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)in_stack_fffffffffffffec8);
      CTxMemPoolEntry::GetCountWithDescendants(in_stack_fffffffffffffea8);
      inline_assertion_check<true,bool>
                ((bool *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,line,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)in_stack_fffffffffffffec8);
      CTxMemPoolEntry::GetCountWithAncestors(in_stack_fffffffffffffea8);
      inline_assertion_check<true,bool>
                ((bool *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,line,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffee8 =
           (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
           CTxMemPoolEntry::GetSizeWithDescendants(in_stack_fffffffffffffea8);
      inline_assertion_check<true,bool>
                ((bool *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,line,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffee0 =
           (AnnotatedMixin<std::recursive_mutex> *)
           CTxMemPoolEntry::GetSizeWithAncestors(in_stack_fffffffffffffea8);
      inline_assertion_check<true,bool>
                ((bool *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,line,
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)in_stack_fffffffffffffec8);
      in_stack_fffffffffffffed8 =
           (CTxMemPool *)CTxMemPoolEntry::GetCountWithAncestors(in_stack_fffffffffffffea8);
      if ((CTxMemPool *)0x1 < in_stack_fffffffffffffed8) {
        in_stack_fffffffffffffed4 = CTxMemPoolEntry::GetTxSize(in_stack_fffffffffffffea8);
        inline_assertion_check<true,bool>
                  ((bool *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (char *)in_stack_fffffffffffffec8);
        in_stack_fffffffffffffec8 =
             (CTxMemPool *)CTxMemPoolEntry::GetMemPoolParentsConst(in_stack_fffffffffffffea8);
        std::
        set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
        ::begin((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)in_stack_fffffffffffffeb0);
        std::_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>::operator->
                  ((_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_> *)
                   in_stack_fffffffffffffea8);
        std::reference_wrapper<const_CTxMemPoolEntry>::get
                  ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffea8);
        CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffeb0);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffffea8);
        inline_assertion_check<true,bool>
                  ((bool *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                   (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (char *)in_stack_fffffffffffffec8);
        std::shared_ptr<const_CTransaction>::~shared_ptr(&in_stack_fffffffffffffea8->tx);
      }
    }
    else {
      in_stack_fffffffffffffec0 =
           (Txid *)CTxMemPoolEntry::GetCountWithAncestors(in_stack_fffffffffffffea8);
      if ((Txid *)0x1 < in_stack_fffffffffffffec0) {
        in_stack_fffffffffffffeb8 =
             CTxMemPoolEntry::GetMemPoolParentsConst(in_stack_fffffffffffffea8);
        std::
        set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
        ::begin((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
                 *)in_stack_fffffffffffffeb0);
        std::
        set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
        ::end((set<std::reference_wrapper<const_CTxMemPoolEntry>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)in_stack_fffffffffffffeb0);
        while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffeb8,
                                       (_Self *)in_stack_fffffffffffffeb0),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          std::_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>::operator*
                    ((_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_> *)
                     in_stack_fffffffffffffea8);
          std::reference_wrapper<const_CTxMemPoolEntry>::get
                    ((reference_wrapper<const_CTxMemPoolEntry> *)in_stack_fffffffffffffea8);
          CTxMemPoolEntry::GetSharedTx(in_stack_fffffffffffffeb0);
          std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffffea8);
          inline_assertion_check<true,bool>
                    ((bool *)in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0,
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (char *)in_stack_fffffffffffffec8);
          std::shared_ptr<const_CTransaction>::~shared_ptr(&in_stack_fffffffffffffea8->tx);
          std::_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_>::operator++
                    ((_Rb_tree_const_iterator<std::reference_wrapper<const_CTxMemPoolEntry>_> *)
                     in_stack_fffffffffffffea8);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
    ::operator++((__normal_iterator<TxMempoolInfo_*,_std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>_>
                  *)in_stack_fffffffffffffea8);
  }
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)in_stack_fffffffffffffeb8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffea8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CheckMempoolTRUCInvariants(const CTxMemPool& tx_pool)
{
    LOCK(tx_pool.cs);
    for (const auto& tx_info : tx_pool.infoAll()) {
        const auto& entry = *Assert(tx_pool.GetEntry(tx_info.tx->GetHash()));
        if (tx_info.tx->version == TRUC_VERSION) {
            // Check that special maximum virtual size is respected
            Assert(entry.GetTxSize() <= TRUC_MAX_VSIZE);

            // Check that special TRUC ancestor/descendant limits and rules are always respected
            Assert(entry.GetCountWithDescendants() <= TRUC_DESCENDANT_LIMIT);
            Assert(entry.GetCountWithAncestors() <= TRUC_ANCESTOR_LIMIT);
            Assert(entry.GetSizeWithDescendants() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE);
            Assert(entry.GetSizeWithAncestors() <= TRUC_MAX_VSIZE + TRUC_CHILD_MAX_VSIZE);

            // If this transaction has at least 1 ancestor, it's a "child" and has restricted weight.
            if (entry.GetCountWithAncestors() > 1) {
                Assert(entry.GetTxSize() <= TRUC_CHILD_MAX_VSIZE);
                // All TRUC transactions must only have TRUC unconfirmed parents.
                const auto& parents = entry.GetMemPoolParentsConst();
                Assert(parents.begin()->get().GetSharedTx()->version == TRUC_VERSION);
            }
        } else if (entry.GetCountWithAncestors() > 1) {
            // All non-TRUC transactions must only have non-TRUC unconfirmed parents.
            for (const auto& parent : entry.GetMemPoolParentsConst()) {
                Assert(parent.get().GetSharedTx()->version != TRUC_VERSION);
            }
        }
    }
}